

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcProfileDef::~IfcProfileDef(IfcProfileDef *this,void **vtt)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)*vtt;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>)._vptr_ObjectHelper =
       pp_Var1;
  *(void **)((long)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>).
                    _vptr_ObjectHelper + (long)pp_Var1[-3]) = vtt[3];
  std::__cxx11::string::~string((string *)&this->ProfileName);
  std::__cxx11::string::~string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>).field_0x10);
  return;
}

Assistant:

IfcProfileDef() : Object("IfcProfileDef") {}